

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int ptrmapGet(BtShared *pBt,Pgno key,u8 *pEType,Pgno *pPgno)

{
  void *pvVar1;
  uint uVar2;
  DbPage *pPg;
  Pgno PVar3;
  int iVar4;
  u32 uVar5;
  int lineno;
  long in_FS_OFFSET;
  DbPage *pDbPage;
  DbPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
  PVar3 = ptrmapPageno(pBt,key);
  iVar4 = (*pBt->pPager->xGet)(pBt->pPager,PVar3,&local_40,0);
  pPg = local_40;
  if (iVar4 == 0) {
    uVar2 = (~PVar3 + key) * 5;
    if ((int)uVar2 < 0) {
      sqlite3PagerUnref(local_40);
      lineno = 0x118ef;
    }
    else {
      pvVar1 = local_40->pData;
      *pEType = *(u8 *)((long)pvVar1 + (ulong)uVar2);
      if (pPgno != (Pgno *)0x0) {
        uVar5 = sqlite3Get4byte((u8 *)((long)pvVar1 + (ulong)uVar2 + 1));
        *pPgno = uVar5;
      }
      sqlite3PagerUnref(pPg);
      iVar4 = 0;
      lineno = 0x118f7;
      if (0xfa < (byte)(*pEType - 6)) goto LAB_0013b88f;
    }
    iVar4 = sqlite3CorruptError(lineno);
  }
LAB_0013b88f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int ptrmapGet(BtShared *pBt, Pgno key, u8 *pEType, Pgno *pPgno){
  DbPage *pDbPage;   /* The pointer map page */
  int iPtrmap;       /* Pointer map page index */
  u8 *pPtrmap;       /* Pointer map page data */
  int offset;        /* Offset of entry in pointer map */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );

  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage, 0);
  if( rc!=0 ){
    return rc;
  }
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    sqlite3PagerUnref(pDbPage);
    return SQLITE_CORRUPT_BKPT;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  assert( pEType!=0 );
  *pEType = pPtrmap[offset];
  if( pPgno ) *pPgno = get4byte(&pPtrmap[offset+1]);

  sqlite3PagerUnref(pDbPage);
  if( *pEType<1 || *pEType>5 ) return SQLITE_CORRUPT_PGNO(iPtrmap);
  return SQLITE_OK;
}